

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O3

bool __thiscall
mp::SolverApp<TestSolver,_TestNLReader2>::Init
          (SolverApp<TestSolver,_TestNLReader2> *this,char **argv,int nl_reader_flags)

{
  size_t sVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  MemoryWriter banner;
  char **local_270;
  pointer local_268 [2];
  BasicWriter<char> local_258;
  Buffer<char> local_248;
  char local_228 [504];
  
  local_270 = argv;
  pcVar5 = internal::SolverAppOptionParser::Parse(&this->option_parser_,&local_270);
  if (pcVar5 != (char *)0x0) {
    if (((this->solver_).super_Solver.super_BasicSolver.bool_options_ & 2) != 0) {
      local_258.buffer_ = &local_248;
      local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00288528;
      local_248.size_ = 0;
      local_248.capacity_ = 500;
      local_248._vptr_Buffer = (_func_int **)&PTR_grow_00288570;
      local_268[0] = (this->solver_).super_Solver.super_BasicSolver.long_name_._M_dataplus._M_p;
      local_248.ptr_ = local_228;
      fmt::BasicWriter<char>::write(&local_258,0x228839,(void *)0xa,(size_t)local_268);
      sVar1 = (local_258.buffer_)->size_;
      if ((local_258.buffer_)->capacity_ < sVar1 + 1) {
        (**(local_258.buffer_)->_vptr_Buffer)();
      }
      (local_258.buffer_)->ptr_[sVar1] = '\0';
      fputs((local_258.buffer_)->ptr_,_stdout);
      fflush(_stdout);
      this->banner_size = (uint)(local_258.buffer_)->size_;
      (this->output_handler_).has_output = false;
      local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_00288528;
      local_248._vptr_Buffer = (_func_int **)&PTR_grow_00288570;
      if (local_248.ptr_ != local_228) {
        operator_delete(local_248.ptr_,local_248.capacity_);
      }
    }
    pcVar2 = (char *)(this->nl_filename)._M_string_length;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&this->nl_filename,0,pcVar2,(ulong)pcVar5);
    std::__cxx11::string::_M_assign((string *)&this->filename_no_ext);
    pcVar5 = strrchr(pcVar5,0x2e);
    if ((pcVar5 == (char *)0x0) || (iVar4 = strcmp(pcVar5,".nl"), iVar4 != 0)) {
      std::__cxx11::string::append((char *)&this->nl_filename);
    }
    else {
      std::__cxx11::string::resize
                ((ulong)&this->filename_no_ext,(char)(this->filename_no_ext)._M_string_length + -3);
    }
    bVar3 = BasicSolver::ParseOptions
                      ((BasicSolver *)&this->solver_,local_270,
                       (this->option_parser_).echo_solver_options_ ^ 1,(ASLProblem *)0x0,(char *)0x0
                      );
    if (bVar3) {
      return true;
    }
    this->result_code_ = 1;
  }
  return false;
}

Assistant:

bool SolverApp<Solver, Reader>::Init(char **argv, int nl_reader_flags) {
  internal::Unused(nl_reader_flags);

  // Parse command-line arguments.
  const char *filename = option_parser_.Parse(argv);
  if (!filename) return false;

  if (solver_.ampl_flag()) {
    fmt::MemoryWriter banner;
    banner.write("{}: ", solver_.long_name());
    std::fputs(banner.c_str(), stdout);
    std::fflush(stdout);
    banner_size = static_cast<unsigned>(banner.size());
    output_handler_.has_output = false;
  }

  // Add .nl extension if necessary.
  nl_filename = filename;
  filename_no_ext = nl_filename;
  const char *ext = std::strrchr(filename, '.');
  if (!ext || std::strcmp(ext, ".nl") != 0)
    nl_filename += ".nl";
  else
    filename_no_ext.resize(filename_no_ext.size() - 3);
  internal::SetBasename(solver_, &filename_no_ext);

  // Parse solver options.
  unsigned flags =
      option_parser_.echo_solver_options() ? 0 : Solver::NO_OPTION_ECHO;
  if (!solver_.ParseOptions(argv, flags)) {
    result_code_ = 1;
    return false;
  }

  return true;
}